

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void float_invalid_op_vxvc(CPUPPCState_conflict *env,_Bool set_fpcc,uintptr_t retaddr)

{
  CPUState_conflict *pCVar1;
  CPUState_conflict *cs;
  uintptr_t retaddr_local;
  _Bool set_fpcc_local;
  CPUPPCState_conflict *env_local;
  
  env->fpscr = env->fpscr | 0x80000;
  if (set_fpcc) {
    env->fpscr = env->fpscr & 0xffff0fff;
    env->fpscr = env->fpscr | 0x11000;
  }
  env->fpscr = env->fpscr | 0x20000000;
  env->fpscr = env->fpscr | 0x80000000;
  if ((env->fpscr >> 7 & 1) != 0) {
    pCVar1 = env_cpu(env);
    pCVar1->exception_index = 6;
    env->error_code = 0x1a;
    env->fpscr = env->fpscr | 0x40000000;
  }
  return;
}

Assistant:

static void float_invalid_op_vxvc(CPUPPCState *env, bool set_fpcc,
                                  uintptr_t retaddr)
{
    env->fpscr |= FP_VXVC;
    if (set_fpcc) {
        env->fpscr &= ~FP_FPCC;
        env->fpscr |= (FP_C | FP_FU);
    }
    /* Update the floating-point invalid operation summary */
    env->fpscr |= FP_VX;
    /* Update the floating-point exception summary */
    env->fpscr |= FP_FX;
    /* We must update the target FPR before raising the exception */
    if (fpscr_ve != 0) {
        CPUState *cs = env_cpu(env);

        cs->exception_index = POWERPC_EXCP_PROGRAM;
        env->error_code = POWERPC_EXCP_FP | POWERPC_EXCP_FP_VXVC;
        /* Update the floating-point enabled exception summary */
        env->fpscr |= FP_FEX;
        /* Exception is deferred */
    }
}